

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSampleVariableTests.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::anon_unknown_2::SampleAverageVerifier::logInfo
          (SampleAverageVerifier *this,TestLog *log)

{
  ostringstream *this_00;
  undefined1 local_190 [120];
  ios_base local_118 [264];
  
  this_00 = (ostringstream *)(local_190 + 8);
  local_190._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,
             "Expecting average sample position to be near the pixel center. Maximum per-axis distance "
             ,0x59);
  std::ostream::_M_insert<double>((double)this->m_distanceThreshold);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base(local_118);
  return;
}

Assistant:

void SampleAverageVerifier::logInfo (tcu::TestLog& log) const
{
	log << tcu::TestLog::Message << "Expecting average sample position to be near the pixel center. Maximum per-axis distance " << m_distanceThreshold << tcu::TestLog::EndMessage;
}